

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O3

spv_result_t
spvtools::val::StructuredSwitchChecks
          (ValidationState_t *_,Function *function,Instruction *switch_inst,BasicBlock *header,
          BasicBlock *merge)

{
  int *piVar1;
  pointer psVar2;
  pointer psVar3;
  _Hash_node_base *p_Var4;
  ValidationState_t *pVVar5;
  _Rb_tree_color _Var6;
  BasicBlock *pBVar7;
  bool bVar8;
  uint uVar9;
  spv_result_t sVar10;
  uint uVar11;
  undefined4 extraout_var;
  BasicBlock *other;
  _Link_type p_Var12;
  pair<unsigned_int,_int> pVar13;
  ulong uVar14;
  _Rb_tree_node_base *p_Var15;
  Instruction *inst;
  ulong uVar16;
  uint uVar17;
  size_t sVar18;
  const_iterator __pos;
  ulong uVar19;
  uint32_t id;
  pair<spvtools::val::BasicBlock_*,_bool> pVar20;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  num_fall_through_targeted;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  seen_to_fall_through;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  case_targets;
  _Rb_tree_color local_324;
  ValidationState_t *local_320;
  BasicBlock *local_318;
  undefined8 local_310;
  uint local_304;
  Function *local_300;
  ulong local_2f8;
  BasicBlock *local_2f0;
  string local_2e8;
  string local_2c8;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_2a8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_278;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_240;
  DiagnosticStream local_208;
  
  local_240._M_buckets = &local_240._M_single_bucket;
  local_240._M_bucket_count = 1;
  local_240._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_240._M_element_count = 0;
  local_240._M_rehash_policy._M_max_load_factor = 1.0;
  local_240._M_rehash_policy._M_next_resize = 0;
  local_240._M_single_bucket = (__node_base_ptr)0x0;
  local_320 = _;
  local_318 = header;
  local_300 = function;
  if (0x10 < (ulong)((long)(switch_inst->operands_).
                           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(switch_inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    sVar18 = 1;
    uVar17 = 3;
    do {
      uVar9 = Instruction::GetOperandAs<unsigned_int>(switch_inst,sVar18);
      local_278._M_buckets = (__buckets_ptr)CONCAT44(local_278._M_buckets._4_4_,uVar9);
      if (uVar9 != merge->id_) {
        local_208._0_8_ = &local_240;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_240,&local_278,&local_208);
      }
      sVar18 = (size_t)uVar17;
      uVar17 = uVar17 + 2;
    } while (sVar18 < (ulong)((long)(switch_inst->operands_).
                                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(switch_inst->operands_).
                                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a8._M_impl.super__Rb_tree_header._M_header;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_310 = 0;
  local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_304 = Instruction::GetOperandAs<unsigned_int>(switch_inst,1);
  uVar16 = (long)(switch_inst->operands_).
                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(switch_inst->operands_).
                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (0x30 < uVar16) {
    sVar18 = 3;
    uVar17 = 5;
    do {
      uVar9 = Instruction::GetOperandAs<unsigned_int>(switch_inst,sVar18);
      psVar2 = (switch_inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      psVar3 = (switch_inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (local_304 == uVar9) {
        uVar16 = (long)psVar3 - (long)psVar2;
        local_310 = CONCAT71((int7)(CONCAT44(extraout_var,uVar9) >> 8),1);
        goto LAB_001a9586;
      }
      sVar18 = (size_t)uVar17;
      uVar16 = (long)psVar3 - (long)psVar2;
      uVar17 = uVar17 + 2;
    } while (sVar18 < (ulong)((long)uVar16 >> 4));
    local_310 = 0;
  }
LAB_001a9586:
  local_278._M_buckets = &local_278._M_single_bucket;
  local_278._M_bucket_count = 1;
  local_278._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_278._M_element_count = 0;
  local_278._M_rehash_policy._M_max_load_factor = 1.0;
  local_278._M_rehash_policy._M_next_resize = 0;
  local_278._M_single_bucket = (__node_base_ptr)0x0;
  local_2f0 = merge;
  if (0x10 < uVar16) {
    local_2f8 = 0;
    uVar16 = 1;
    uVar17 = 3;
    do {
      pVar13.first = Instruction::GetOperandAs<unsigned_int>(switch_inst,uVar16);
      uVar14 = local_2f8;
      if (pVar13.first != local_2f0->id_) {
        local_324 = _S_red;
        if (local_278._M_buckets[(ulong)pVar13.first % local_278._M_bucket_count] !=
            (__node_base_ptr)0x0) {
          p_Var4 = local_278._M_buckets[(ulong)pVar13.first % local_278._M_bucket_count]->_M_nxt;
          uVar9 = *(uint *)&p_Var4[1]._M_nxt;
          do {
            if (pVar13.first == uVar9) {
              uVar14 = (ulong)*(uint *)((long)&p_Var4[1]._M_nxt + 4);
              goto LAB_001a974c;
            }
            p_Var4 = p_Var4->_M_nxt;
          } while ((p_Var4 != (_Hash_node_base *)0x0) &&
                  (uVar9 = *(uint *)&p_Var4[1]._M_nxt,
                  (ulong)uVar9 % local_278._M_bucket_count ==
                  (ulong)pVar13.first % local_278._M_bucket_count));
        }
        pVar20 = Function::GetBlock(local_300,pVar13.first);
        other = pVar20.first;
        if ((local_318->structurally_reachable_ == true) &&
           ((other->structurally_reachable_ == true &&
            (bVar8 = BasicBlock::structurally_dominates(local_318,other), pBVar7 = local_318,
            pVVar5 = local_320, !bVar8)))) {
          ValidationState_t::diag(&local_208,local_320,SPV_ERROR_INVALID_CFG,local_318->label_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"Switch header ",0xe);
          ValidationState_t::getIdName_abi_cxx11_(&local_2e8,pVVar5,pBVar7->id_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208," does not structurally dominate its case construct ",
                     0x33);
          ValidationState_t::getIdName_abi_cxx11_(&local_2c8,pVVar5,pVar13.first);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
          sVar10 = local_208.error_;
LAB_001a9942:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_001a9962;
        }
        sVar10 = FindCaseFallThrough(local_320,other,&local_324,local_2f0,
                                     (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                      *)&local_240,local_300);
        _Var6 = local_324;
        if (sVar10 != SPV_SUCCESS) goto LAB_001a9981;
        uVar14 = (ulong)local_324;
        if (uVar14 != 0) {
          __pos._M_node = &local_2a8._M_impl.super__Rb_tree_header._M_header;
          p_Var12 = (_Link_type)local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent;
          if ((_Link_type)local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent !=
              (_Link_type)0x0) {
            do {
              bVar8 = ((_Base_ptr)&p_Var12->_M_storage)->_M_color < local_324;
              if (!bVar8) {
                __pos._M_node = &p_Var12->super__Rb_tree_node_base;
              }
              p_Var12 = *(_Link_type *)
                         ((long)&p_Var12->_M_storage + (ulong)bVar8 * 8 + 0xfffffffffffffff0);
            } while (p_Var12 != (_Link_type)0x0);
            if (((_Rb_tree_header *)__pos._M_node != &local_2a8._M_impl.super__Rb_tree_header) &&
               ((_Rb_tree_color)*(size_t *)(((_Link_type)__pos._M_node)->_M_storage)._M_storage ==
                local_324)) {
              piVar1 = (int *)((long)(((_Link_type)__pos._M_node)->_M_storage)._M_storage + 4);
              *piVar1 = *piVar1 + 1;
              goto LAB_001a9725;
            }
          }
          local_208._0_8_ = uVar14 | 0x100000000;
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
          ::_M_emplace_hint_unique<std::pair<unsigned_int,int>>
                    ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                      *)&local_2a8,__pos,(pair<unsigned_int,_int> *)&local_208);
        }
LAB_001a9725:
        pVar13.second = _Var6;
        local_208._0_8_ = pVar13;
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_int,unsigned_int>>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&local_278,&local_208);
LAB_001a974c:
        uVar19 = local_2f8 & 0xffffffff;
        if ((uint)uVar14 != local_304) {
          uVar19 = uVar14;
        }
        if ((char)local_310 != '\0') {
          uVar19 = uVar14;
        }
        id = (uint32_t)uVar19;
        uVar14 = local_2f8;
        if ((id != 0) && (uVar9 = uVar17, uVar14 = uVar19, (int)uVar16 != 1)) {
          do {
            uVar19 = (ulong)uVar9;
            uVar14 = (long)(switch_inst->operands_).
                           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(switch_inst->operands_).
                           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4;
            if (uVar14 <= uVar19) goto LAB_001a97b0;
            uVar11 = Instruction::GetOperandAs<unsigned_int>(switch_inst,uVar19);
            uVar9 = uVar9 + 2;
          } while (pVar13.first == uVar11);
          uVar14 = (long)(switch_inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(switch_inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4;
LAB_001a97b0:
          if ((uVar14 < uVar19) ||
             (uVar9 = Instruction::GetOperandAs<unsigned_int>(switch_inst,uVar19),
             uVar14 = local_2f8, id != uVar9)) {
            pVVar5 = local_320;
            ValidationState_t::diag(&local_208,local_320,SPV_ERROR_INVALID_CFG,switch_inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"Case construct that targets ",0x1c);
            ValidationState_t::getIdName_abi_cxx11_(&local_2e8,pVVar5,pVar13.first);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208," has branches to the case construct that targets ",
                       0x31);
            ValidationState_t::getIdName_abi_cxx11_(&local_2c8,pVVar5,id);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,
                       ", but does not immediately precede it in the OpSwitch\'s target list",0x43);
            sVar10 = local_208.error_;
            goto LAB_001a9942;
          }
        }
      }
      local_2f8 = uVar14;
      uVar16 = (ulong)((int)uVar16 + 2);
      uVar17 = uVar17 + 2;
    } while (uVar16 < (ulong)((long)(switch_inst->operands_).
                                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(switch_inst->operands_).
                                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  pVVar5 = local_320;
  p_Var15 = local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    sVar10 = SPV_SUCCESS;
    local_320 = pVVar5;
    if ((_Rb_tree_header *)p_Var15 == &local_2a8._M_impl.super__Rb_tree_header) goto LAB_001a9981;
    if (1 < *(uint *)&p_Var15[1].field_0x4) break;
    p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
    pVVar5 = local_320;
  }
  inst = ValidationState_t::FindDef(pVVar5,p_Var15[1]._M_color);
  ValidationState_t::diag(&local_208,pVVar5,SPV_ERROR_INVALID_CFG,inst);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_208,
             "Multiple case constructs have branches to the case construct that targets ",0x4a);
  ValidationState_t::getIdName_abi_cxx11_(&local_2e8,pVVar5,p_Var15[1]._M_color);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_208,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
  sVar10 = local_208.error_;
LAB_001a9962:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  DiagnosticStream::~DiagnosticStream(&local_208);
LAB_001a9981:
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_278);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::_M_erase(&local_2a8,(_Link_type)local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_240);
  return sVar10;
}

Assistant:

spv_result_t StructuredSwitchChecks(ValidationState_t& _, Function* function,
                                    const Instruction* switch_inst,
                                    const BasicBlock* header,
                                    const BasicBlock* merge) {
  std::unordered_set<uint32_t> case_targets;
  for (uint32_t i = 1; i < switch_inst->operands().size(); i += 2) {
    uint32_t target = switch_inst->GetOperandAs<uint32_t>(i);
    if (target != merge->id()) case_targets.insert(target);
  }
  // Tracks how many times each case construct is targeted by another case
  // construct.
  std::map<uint32_t, uint32_t> num_fall_through_targeted;
  uint32_t default_case_fall_through = 0u;
  uint32_t default_target = switch_inst->GetOperandAs<uint32_t>(1u);
  bool default_appears_multiple_times = false;
  for (uint32_t i = 3; i < switch_inst->operands().size(); i += 2) {
    if (default_target == switch_inst->GetOperandAs<uint32_t>(i)) {
      default_appears_multiple_times = true;
      break;
    }
  }
  std::unordered_map<uint32_t, uint32_t> seen_to_fall_through;
  for (uint32_t i = 1; i < switch_inst->operands().size(); i += 2) {
    uint32_t target = switch_inst->GetOperandAs<uint32_t>(i);
    if (target == merge->id()) continue;

    uint32_t case_fall_through = 0u;
    auto seen_iter = seen_to_fall_through.find(target);
    if (seen_iter == seen_to_fall_through.end()) {
      const auto target_block = function->GetBlock(target).first;
      // OpSwitch must dominate all its case constructs.
      if (header->structurally_reachable() &&
          target_block->structurally_reachable() &&
          !header->structurally_dominates(*target_block)) {
        return _.diag(SPV_ERROR_INVALID_CFG, header->label())
               << "Switch header " << _.getIdName(header->id())
               << " does not structurally dominate its case construct "
               << _.getIdName(target);
      }

      if (auto error = FindCaseFallThrough(_, target_block, &case_fall_through,
                                           merge, case_targets, function)) {
        return error;
      }

      // Track how many time the fall through case has been targeted.
      if (case_fall_through != 0u) {
        auto where = num_fall_through_targeted.lower_bound(case_fall_through);
        if (where == num_fall_through_targeted.end() ||
            where->first != case_fall_through) {
          num_fall_through_targeted.insert(
              where, std::make_pair(case_fall_through, 1));
        } else {
          where->second++;
        }
      }
      seen_to_fall_through.insert(std::make_pair(target, case_fall_through));
    } else {
      case_fall_through = seen_iter->second;
    }

    if (case_fall_through == default_target &&
        !default_appears_multiple_times) {
      case_fall_through = default_case_fall_through;
    }
    if (case_fall_through != 0u) {
      bool is_default = i == 1;
      if (is_default) {
        default_case_fall_through = case_fall_through;
      } else {
        // Allow code like:
        // case x:
        // case y:
        //   ...
        // case z:
        //
        // Where x and y target the same block and fall through to z.
        uint32_t j = i;
        while ((j + 2 < switch_inst->operands().size()) &&
               target == switch_inst->GetOperandAs<uint32_t>(j + 2)) {
          j += 2;
        }
        // If Target T1 branches to Target T2, or if Target T1 branches to the
        // Default target and the Default target branches to Target T2, then T1
        // must immediately precede T2 in the list of OpSwitch Target operands.
        if ((switch_inst->operands().size() < j + 2) ||
            (case_fall_through != switch_inst->GetOperandAs<uint32_t>(j + 2))) {
          return _.diag(SPV_ERROR_INVALID_CFG, switch_inst)
                 << "Case construct that targets " << _.getIdName(target)
                 << " has branches to the case construct that targets "
                 << _.getIdName(case_fall_through)
                 << ", but does not immediately precede it in the "
                    "OpSwitch's target list";
        }
      }
    }
  }

  // Each case construct must be branched to by at most one other case
  // construct.
  for (const auto& pair : num_fall_through_targeted) {
    if (pair.second > 1) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(pair.first))
             << "Multiple case constructs have branches to the case construct "
                "that targets "
             << _.getIdName(pair.first);
    }
  }

  return SPV_SUCCESS;
}